

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picPageAnalyzer_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  ostream *poVar5;
  string inputPage;
  picPageAnalyzer picAna;
  ifstream fin;
  string local_298;
  string local_278;
  picPageAnalyzer local_258;
  long local_220 [4];
  byte abStack_200 [488];
  
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
  std::ifstream::ifstream(local_220,"./testPic.html",_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    while ((abStack_200[*(long *)(local_220[0] + -0x18)] & 2) == 0) {
      std::istream::get();
      std::__cxx11::string::push_back((char)&local_278);
    }
  }
  std::ifstream::close();
  picPageAnalyzer::picPageAnalyzer(&local_258,&local_278);
  iVar3 = picPageAnalyzer::getCurrentPageNumber(&local_258);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  picPageAnalyzer::getPrevPageURL_abi_cxx11_(&local_298,&local_258);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  paVar1 = &local_298.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  picPageAnalyzer::getNextPageURL_abi_cxx11_(&local_298,&local_258);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  picPageAnalyzer::getLossyPicSourceURL_abi_cxx11_(&local_298,&local_258);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  picPageAnalyzer::getOriginalPicSourceURL_abi_cxx11_(&local_298,&local_258);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258.super_pageAnalyzer.pageContent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.super_pageAnalyzer.inputPage._M_dataplus._M_p !=
      &local_258.super_pageAnalyzer.inputPage.field_2) {
    operator_delete(local_258.super_pageAnalyzer.inputPage._M_dataplus._M_p,
                    local_258.super_pageAnalyzer.inputPage.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    std::string inputPage = std::string("");

    std::ifstream fin("./testPic.html", std::ios::in);
    if(fin.is_open())
    {
        while (!fin.eof())
            inputPage += fin.get();
    }
    fin.close();

    picPageAnalyzer picAna = picPageAnalyzer(inputPage);
    std::cout << picAna.getCurrentPageNumber() << std::endl;
    std::cout << picAna.getPrevPageURL() << std::endl;
    std::cout << picAna.getNextPageURL() << std::endl;
    std::cout << picAna.getLossyPicSourceURL() << std::endl;
    std::cout << picAna.getOriginalPicSourceURL() << std::endl;

    return 0;
}